

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O1

int luaL_execresult(lua_State *L,int stat)

{
  int iVar1;
  int *piVar2;
  
  if (stat == 0) {
    lua_pushboolean(L,1);
  }
  else {
    piVar2 = __errno_location();
    if (*piVar2 != 0) {
      iVar1 = luaL_fileresult(L,0,(char *)0x0);
      return iVar1;
    }
    lua_pushnil(L);
  }
  lua_pushstring(L,"exit");
  lua_pushinteger(L,(long)stat);
  return 3;
}

Assistant:

LUALIB_API int luaL_execresult (lua_State *L, int stat) {
  if (stat != 0 && errno != 0)  /* error with an 'errno'? */
    return luaL_fileresult(L, 0, NULL);
  else {
    const char *what = "exit";  /* type of termination */
    l_inspectstat(stat, what);  /* interpret result */
    if (*what == 'e' && stat == 0)  /* successful termination? */
      lua_pushboolean(L, 1);
    else
      luaL_pushfail(L);
    lua_pushstring(L, what);
    lua_pushinteger(L, stat);
    return 3;  /* return true/fail,what,code */
  }
}